

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O2

void FAudio_INTERNAL_Convert_S16_To_F32_SSE2(int16_t *src,float *dst,uint32_t len)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  float *pfVar11;
  
  uVar9 = (ulong)(len - 1);
  lVar10 = 0x1c;
  lVar8 = 0;
  uVar6 = len;
  for (pfVar11 = dst + (uVar9 - 7); (uVar6 != 0 && (((ulong)pfVar11 & 0xf) != 0));
      pfVar11 = pfVar11 + -1) {
    *(float *)((long)dst + lVar8 * 2 + uVar9 * 4) =
         (float)(int)*(short *)((long)src + lVar8 + uVar9 * 2) * 3.0517578e-05;
    lVar8 = lVar8 + -2;
    lVar10 = lVar10 + 4;
    uVar6 = uVar6 - 1;
  }
  lVar10 = (long)dst + (uVar9 * 4 - lVar10);
  if ((((int)src + (len - 1) * 2 + (int)lVar8) - 0xe & 0xf) == 0) {
    for (; 7 < (int)uVar6; uVar6 = uVar6 - 8) {
      piVar1 = (int *)((long)src + lVar8 + uVar9 * 2 + -0xe);
      iVar2 = *piVar1;
      iVar3 = piVar1[1];
      iVar4 = piVar1[2];
      iVar5 = piVar1[3];
      pfVar11 = (float *)((long)dst + lVar8 * 2 + uVar9 * 4 + -0x1c);
      *pfVar11 = (float)(int)(short)iVar2 * 3.0517578e-05;
      pfVar11[1] = (float)(iVar2 >> 0x10) * 3.0517578e-05;
      pfVar11[2] = (float)(int)(short)iVar3 * 3.0517578e-05;
      pfVar11[3] = (float)(iVar3 >> 0x10) * 3.0517578e-05;
      pfVar11 = (float *)((long)dst + lVar8 * 2 + uVar9 * 4 + -0xc);
      *pfVar11 = (float)(int)(short)iVar4 * 3.0517578e-05;
      pfVar11[1] = (float)(iVar4 >> 0x10) * 3.0517578e-05;
      pfVar11[2] = (float)(int)(short)iVar5 * 3.0517578e-05;
      pfVar11[3] = (float)(iVar5 >> 0x10) * 3.0517578e-05;
      lVar10 = lVar10 + -0x20;
      lVar8 = lVar8 + -0x10;
    }
  }
  for (lVar7 = 0; -uVar6 != (int)lVar7; lVar7 = lVar7 + -1) {
    *(float *)(lVar10 + 0x1c + lVar7 * 4) =
         (float)(int)*(short *)((long)src + lVar7 * 2 + lVar8 + uVar9 * 2) * 3.0517578e-05;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Convert_S16_To_F32_SSE2(
	const int16_t *restrict src,
	float *restrict dst,
	uint32_t len
) {
    int i;
    src += len - 1;
    dst += len - 1;

    /* Get dst aligned to 16 bytes (since buffer is growing, we don't have to worry about overreading from src) */
    for (i = len; i && (((size_t) (dst-7)) & 15); --i, --src, --dst) {
        *dst = ((float) *src) * DIVBY32768;
    }

    src -= 7; dst -= 7;  /* adjust to read SSE blocks from the start. */
    FAudio_assert(!i || ((((size_t) dst) & 15) == 0));

    /* Make sure src is aligned too. */
    if ((((size_t) src) & 15) == 0) {
        /* Aligned! Do SSE blocks as long as we have 16 bytes available. */
        const __m128 divby32768 = _mm_set1_ps(DIVBY32768);
        while (i >= 8) {   /* 8 * 16-bit */
            const __m128i ints = _mm_load_si128((__m128i const *) src);  /* get 8 sint16 into an XMM register. */
            /* treat as int32, shift left to clear every other sint16, then back right with sign-extend. Now sint32. */
            const __m128i a = _mm_srai_epi32(_mm_slli_epi32(ints, 16), 16);
            /* right-shift-sign-extend gets us sint32 with the other set of values. */
            const __m128i b = _mm_srai_epi32(ints, 16);
            /* Interleave these back into the right order, convert to float, multiply, store. */
            _mm_store_ps(dst, _mm_mul_ps(_mm_cvtepi32_ps(_mm_unpacklo_epi32(a, b)), divby32768));
            _mm_store_ps(dst+4, _mm_mul_ps(_mm_cvtepi32_ps(_mm_unpackhi_epi32(a, b)), divby32768));
            i -= 8; src -= 8; dst -= 8;
        }
    }

    src += 7; dst += 7;  /* adjust for any scalar finishing. */

    /* Finish off any leftovers with scalar operations. */
    while (i) {
        *dst = ((float) *src) * DIVBY32768;
        i--; src--; dst--;
    }
}